

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_addstr(wchar_t n,wchar_t a,char *buf)

{
  int *piVar1;
  int iVar2;
  term_win *ptVar3;
  int iVar4;
  ulong uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t n_00;
  ulong uVar8;
  ulong uVar9;
  wchar_t s [1024];
  wchar_t local_1028 [1024];
  
  iVar2 = Term->wid;
  text_mbstowcs(local_1028,buf,L'Ѐ');
  ptVar3 = Term->scr;
  wVar6 = L'\xffffffff';
  if (ptVar3->cu == false) {
    uVar5 = (ulong)(iVar2 + 1);
    if (L'\xffffffff' < n) {
      uVar5 = (ulong)(uint)n;
    }
    uVar9 = 0;
    if (0 < (int)uVar5) {
      uVar8 = 0;
      do {
        uVar9 = uVar8;
        if (local_1028[uVar8] == L'\0') break;
        uVar8 = uVar8 + 1;
        uVar9 = uVar5;
      } while (uVar5 != uVar8);
    }
    wVar6 = ptVar3->cx;
    wVar7 = iVar2 - wVar6;
    iVar4 = wVar6 + (wchar_t)uVar9;
    n_00 = (wchar_t)uVar9;
    if (iVar2 <= iVar4) {
      n_00 = wVar7;
    }
    Term_queue_chars(wVar6,ptVar3->cy,n_00,a,local_1028);
    ptVar3 = Term->scr;
    piVar1 = &ptVar3->cx;
    *piVar1 = *piVar1 + n_00;
    wVar6 = L'\0';
    if (wVar7 != L'\0' && iVar2 <= iVar4) {
      ptVar3->cu = true;
      wVar6 = wVar7;
    }
  }
  return wVar6;
}

Assistant:

errr Term_addstr(int n, int a, const char *buf)
{
	int k;

	int w = Term->wid;

	errr res = 0;

	wchar_t s[1024];

	/* Copy to a rewriteable string */
 	text_mbstowcs(s, buf, 1024);

	/* Handle "unusable" cursor */
	if (Term->scr->cu) return (-1);

	/* Obtain maximal length */
	k = (n < 0) ? (w + 1) : n;

	/* Obtain the usable string length */
	for (n = 0; (n < k) && s[n]; n++) /* loop */;

	/* React to reaching the edge of the screen */
	if (Term->scr->cx + n >= w) res = n = w - Term->scr->cx;

	/* Queue the first "n" characters for display */
	Term_queue_chars(Term->scr->cx, Term->scr->cy, n, a, s);

	/* Advance the cursor */
	Term->scr->cx += n;

	/* Hack -- Notice "Useless" cursor */
	if (res) Term->scr->cu = 1;

	/* Success (usually) */
	return (res);
}